

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseExprCastValueAndTrailingE(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  ParseState copy;
  
  iVar7 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar7 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar7) {
    bVar8 = false;
    goto LAB_0027218b;
  }
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar6 = ParseNumber(state,(int *)0x0);
  if (bVar6) {
    bVar6 = ParseOneCharToken(state,'E');
    bVar8 = true;
    if (!bVar6) goto LAB_00272122;
  }
  else {
LAB_00272122:
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseFloatNumber(state);
    if (bVar6) {
      bVar6 = ParseOneCharToken(state,'E');
      bVar8 = true;
      if (bVar6) goto LAB_00272186;
      bVar6 = ParseOneCharToken(state,'_');
      if (bVar6) {
        bVar6 = ParseFloatNumber(state);
        if (bVar6) {
          bVar6 = ParseOneCharToken(state,'E');
          if (bVar6) goto LAB_00272186;
        }
      }
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar8 = false;
  }
LAB_00272186:
  iVar7 = state->recursion_depth + -1;
LAB_0027218b:
  state->recursion_depth = iVar7;
  return bVar8;
}

Assistant:

static bool ParseExprCastValueAndTrailingE(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  // We have to be able to backtrack after accepting a number because we could
  // have e.g. "7fffE", which will accept "7" as a number but then fail to find
  // the 'E'.
  ParseState copy = state->parse_state;
  if (ParseNumber(state, nullptr) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseFloatNumber(state)) {
    // <float> for ordinary floating-point types
    if (ParseOneCharToken(state, 'E')) return true;

    // <float> _ <float> for complex floating-point types
    if (ParseOneCharToken(state, '_') && ParseFloatNumber(state) &&
        ParseOneCharToken(state, 'E')) {
      return true;
    }
  }
  state->parse_state = copy;

  return false;
}